

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O0

void __thiscall QVariantAnimation::setEasingCurve(QVariantAnimation *this,QEasingCurve *easing)

{
  byte bVar1;
  QVariantAnimationPrivate *pQVar2;
  QEasingCurve *in_RSI;
  bool valueChanged;
  QVariantAnimationPrivate *d;
  QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
  *in_stack_00000050;
  bool in_stack_00000067;
  QVariantAnimationPrivate *in_stack_00000068;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe7;
  
  pQVar2 = d_func((QVariantAnimation *)0x68ec5c);
  QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
              *)in_RSI);
  QPropertyData<QEasingCurve>::valueBypassingBindings
            (&(pQVar2->easing).super_QPropertyData<QEasingCurve>);
  bVar1 = ::operator!=((QEasingCurve *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0)
                       ,in_RSI);
  QPropertyData<QEasingCurve>::setValueBypassingBindings
            ((QPropertyData<QEasingCurve> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_RSI);
  QVariantAnimationPrivate::recalculateCurrentInterval(in_stack_00000068,in_stack_00000067);
  if ((bVar1 & 1) != 0) {
    QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
    ::notify(in_stack_00000050);
  }
  return;
}

Assistant:

void QVariantAnimation::setEasingCurve(const QEasingCurve &easing)
{
    Q_D(QVariantAnimation);
    d->easing.removeBindingUnlessInWrapper();
    const bool valueChanged = easing != d->easing.valueBypassingBindings();
    d->easing.setValueBypassingBindings(easing);
    d->recalculateCurrentInterval();
    if (valueChanged)
        d->easing.notify();
}